

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O2

int __thiscall QPicture::metric(QPicture *this,PaintDeviceMetric m)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  int iVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar5 = boundingRect(this);
  auVar3 = QVar5._0_12_;
  iVar4 = 0x1000000;
  switch(m) {
  case PdmHeight:
    auVar1._8_8_ = QVar5._8_8_ >> 0x20;
    auVar1._0_8_ = QVar5._0_8_ >> 0x20;
    auVar3 = auVar1._0_12_;
  case PdmWidth:
    iVar4 = (auVar3._8_4_ - auVar3._0_4_) + 1;
    break;
  case PdmWidthMM:
    iVar4 = qt_defaultDpiX();
    goto LAB_0028d949;
  case PdmHeightMM:
    iVar4 = qt_defaultDpiY();
    auVar2._8_8_ = QVar5._8_8_ >> 0x20;
    auVar2._0_8_ = QVar5._0_8_ >> 0x20;
    auVar3 = auVar2._0_12_;
LAB_0028d949:
    iVar4 = (int)((double)((auVar3._8_4_ - auVar3._0_4_) + 1) * (25.4 / (double)iVar4));
    break;
  case PdmNumColors:
    break;
  case PdmDepth:
    iVar4 = 0x18;
    break;
  case PdmDpiX:
  case PdmPhysicalDpiX:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar4 = qt_defaultDpiX();
      return iVar4;
    }
    goto LAB_0028d9b7;
  case PdmDpiY:
  case PdmPhysicalDpiY:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar4 = qt_defaultDpiY();
      return iVar4;
    }
    goto LAB_0028d9b7;
  case PdmDevicePixelRatio:
    iVar4 = 1;
    break;
  case PdmDevicePixelRatioScaled:
    iVar4 = 0x10000;
    break;
  default:
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_30 = "default";
    iVar4 = 0;
    QMessageLogger::warning(local_48,"QPicture::metric: Invalid metric command");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
LAB_0028d9b7:
  __stack_chk_fail();
}

Assistant:

int QPicture::metric(PaintDeviceMetric m) const
{
    int val;
    QRect brect = boundingRect();
    switch (m) {
        case PdmWidth:
            val = brect.width();
            break;
        case PdmHeight:
            val = brect.height();
            break;
        case PdmWidthMM:
            val = int(25.4/qt_defaultDpiX()*brect.width());
            break;
        case PdmHeightMM:
            val = int(25.4/qt_defaultDpiY()*brect.height());
            break;
        case PdmDpiX:
        case PdmPhysicalDpiX:
            val = qt_defaultDpiX();
            break;
        case PdmDpiY:
        case PdmPhysicalDpiY:
            val = qt_defaultDpiY();
            break;
        case PdmNumColors:
            val = 16777216;
            break;
        case PdmDepth:
            val = 24;
            break;
        case PdmDevicePixelRatio:
            val = 1;
            break;
        case PdmDevicePixelRatioScaled:
            val = 1 * QPaintDevice::devicePixelRatioFScale();
            break;
        default:
            val = 0;
            qWarning("QPicture::metric: Invalid metric command");
    }
    return val;
}